

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O1

bool __thiscall QCss::Parser::parseHexColor(Parser *this,QColor *col)

{
  Spec SVar1;
  long lVar2;
  int *piVar3;
  long lVar4;
  int iVar5;
  size_t extraout_RDX;
  long lVar6;
  Symbol *pSVar7;
  long in_FS_OFFSET;
  QColor QVar8;
  QAnyStringView name;
  QString local_78;
  QString local_60;
  QString local_48;
  char *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  Symbol::lexem(&local_48,(this->symbols).d.ptr + (long)this->index + -1);
  name.field_0.m_data =
       (void *)(CONCAT44(local_48.d.size._4_4_,(undefined4)local_48.d.size) | 0x8000000000000000);
  name.m_size = extraout_RDX;
  QVar8 = QColor::fromString((QColor *)CONCAT44(local_48.d.ptr._4_4_,local_48.d.ptr._0_4_),name);
  *(long *)col = QVar8._0_8_;
  *(int *)((long)&col->ct + 4) = QVar8.ct._4_4_;
  (col->ct).argb.pad = QVar8.ct._8_2_;
  piVar3 = (int *)CONCAT44(local_48.d.d._4_4_,local_48.d.d._0_4_);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(local_48.d.d._4_4_,local_48.d.d._0_4_),2,0x10);
    }
  }
  SVar1 = col->cspec;
  if (SVar1 == Invalid) {
    local_48.d.d._0_4_ = 2;
    local_48.d.d._4_4_ = 0;
    local_48.d.ptr._0_4_ = 0;
    local_48.d.ptr._4_4_ = 0;
    local_48.d.size._0_4_ = 0;
    local_48.d.size._4_4_ = 0;
    local_30 = "default";
    Symbol::lexem(&local_78,(this->symbols).d.ptr + (long)this->index + -1);
    QString::toLatin1_helper_inplace(&local_60);
    if (local_60.d.ptr == (char16_t *)0x0) {
      local_60.d.ptr = (char16_t *)&QByteArray::_empty;
    }
    QMessageLogger::warning
              ((char *)&local_48,"QCssParser::parseHexColor: Unknown color name \'%s\'",
               local_60.d.ptr);
    if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,1,0x10);
      }
    }
    if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  else {
    lVar2 = (this->symbols).d.size;
    iVar5 = this->index;
    lVar6 = (long)iVar5;
    lVar4 = lVar2 - lVar6;
    if (lVar4 != 0 && lVar6 <= lVar2) {
      pSVar7 = (this->symbols).d.ptr + lVar6;
      do {
        iVar5 = iVar5 + 1;
        if (pSVar7->token != S) break;
        this->index = iVar5;
        pSVar7 = pSVar7 + 1;
        lVar4 = lVar4 + -1;
      } while (lVar4 != 0);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return SVar1 != Invalid;
  }
  __stack_chk_fail();
}

Assistant:

bool Parser::parseHexColor(QColor *col)
{
    *col = QColor::fromString(lexem());
    if (!col->isValid()) {
        qWarning("QCssParser::parseHexColor: Unknown color name '%s'",lexem().toLatin1().constData());
        return false;
    }
    skipSpace();
    return true;
}